

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86_avx.cpp
# Opt level: O0

void ncnn::binary_op_vector_broadcast_pb<ncnn::BinaryOp_x86_avx_functor::binary_op_pow>
               (float *ptr,float *ptr1,float *outptr,int w,int elempack)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  int in_ECX;
  undefined8 *in_RDX;
  float *in_RSI;
  undefined1 (*in_RDI) [32];
  int in_R8D;
  float fVar63;
  float fVar64;
  float fVar65;
  float fVar66;
  __m128 _outp_2;
  __m128 _b_2;
  __m128 _p_2;
  __m256 _outp_1;
  __m256 _b_1;
  __m128 _b1;
  __m128 _b0;
  __m256 _p_1;
  int i_1;
  __m256 _outp;
  __m256 _b;
  __m256 _p;
  int i;
  binary_op_pow op;
  __m256 pow2n_1;
  __m256 y_3;
  __m256 mask_3;
  __m256 one_3;
  __m256i imm0_3;
  __m256 fx_1;
  __m256 tmp_3;
  __m256 pow2n;
  __m256 y_1;
  __m256 mask_1;
  __m256 one_1;
  __m256i imm0_1;
  __m256 fx;
  __m256 tmp_1;
  __m256 y_2;
  __m256 z_1;
  __m256 tmp_2;
  __m256 mask_2;
  __m256 e_1;
  __m256 invalid_mask_1;
  __m256 one_2;
  __m256i imm0_2;
  __m256 y;
  __m256 z;
  __m256 tmp;
  __m256 mask;
  __m256 e;
  __m256 invalid_mask;
  __m256 one;
  __m256i imm0;
  imm_xmm_union u_7;
  imm_xmm_union u_6;
  imm_xmm_union u_5;
  __m256i ret_2;
  __m128i y2_1;
  __m128i y1_1;
  __m128i x2_2;
  __m128i x1_2;
  imm_xmm_union u_17;
  imm_xmm_union u_16;
  imm_xmm_union u_15;
  __m256i ret_6;
  __m128i y2_3;
  __m128i y1_3;
  __m128i x2_6;
  __m128i x1_6;
  imm_xmm_union u_9;
  imm_xmm_union u_8;
  __m256i ret_3;
  __m128i x2_3;
  __m128i x1_3;
  imm_xmm_union u_19;
  imm_xmm_union u_18;
  __m256i ret_7;
  __m128i x2_7;
  __m128i x1_7;
  imm_xmm_union u_1;
  imm_xmm_union u;
  __m256i ret;
  __m128i x2;
  __m128i x1;
  imm_xmm_union u_11;
  imm_xmm_union u_10;
  __m256i ret_4;
  __m128i x2_4;
  __m128i x1_4;
  imm_xmm_union u_4;
  imm_xmm_union u_3;
  imm_xmm_union u_2;
  __m256i ret_1;
  __m128i y2;
  __m128i y1;
  __m128i x2_1;
  __m128i x1_1;
  imm_xmm_union u_14;
  imm_xmm_union u_13;
  imm_xmm_union u_12;
  __m256i ret_5;
  __m128i y2_2;
  __m128i y1_2;
  __m128i x2_5;
  __m128i x1_5;
  v4sf pow2n_2;
  v4sf y_5;
  v4sf mask_5;
  v4sf one_5;
  v4si emm0_1;
  v4sf fx_2;
  v4sf tmp_5;
  v4sf y_4;
  v4sf z_2;
  v4sf tmp_4;
  v4sf mask_4;
  v4sf e_2;
  v4sf invalid_mask_2;
  v4sf one_4;
  v4si emm0;
  int local_4284;
  int local_4218;
  undefined8 *local_4208;
  float *local_4200;
  undefined1 (*local_41f8) [32];
  float local_3fe0;
  float fStack_3fdc;
  float fStack_3fd8;
  float fStack_3fd4;
  float fStack_3fd0;
  float fStack_3fcc;
  float fStack_3fc8;
  float local_3fc0;
  float fStack_3fbc;
  float fStack_3fb8;
  float fStack_3fb4;
  float fStack_3fb0;
  float fStack_3fac;
  float fStack_3fa8;
  undefined4 uStack_3fa4;
  float local_3f60;
  float fStack_3f5c;
  float fStack_3f58;
  float fStack_3f54;
  float fStack_3f50;
  float fStack_3f4c;
  float fStack_3f48;
  undefined8 local_3f00;
  undefined8 uStack_3ef8;
  undefined8 uStack_3ef0;
  undefined8 uStack_3ee8;
  undefined8 local_3ea0;
  undefined8 uStack_3e98;
  undefined8 uStack_3e90;
  undefined8 uStack_3e88;
  undefined1 local_3e80 [8];
  float fStack_3e78;
  float fStack_3e74;
  float fStack_3e70;
  float fStack_3e6c;
  float fStack_3e68;
  undefined4 uStack_3e64;
  undefined1 local_3e40 [8];
  float fStack_3e38;
  float fStack_3e34;
  undefined8 uStack_3e30;
  undefined8 uStack_3e28;
  float local_3da0;
  float fStack_3d9c;
  float fStack_3d98;
  float fStack_3d94;
  float fStack_3d90;
  float fStack_3d8c;
  float fStack_3d88;
  float local_3d40;
  float fStack_3d3c;
  float fStack_3d38;
  float fStack_3d34;
  float fStack_3d30;
  float fStack_3d2c;
  float fStack_3d28;
  float fStack_3d24;
  undefined8 local_3c80;
  undefined8 uStack_3c78;
  undefined8 uStack_3c70;
  undefined8 uStack_3c68;
  undefined8 local_3c20;
  undefined8 uStack_3c18;
  undefined8 uStack_3c10;
  undefined8 uStack_3c08;
  undefined1 local_3c00 [8];
  float fStack_3bf8;
  float fStack_3bf4;
  float fStack_3bf0;
  float fStack_3bec;
  float fStack_3be8;
  undefined4 uStack_3be4;
  undefined1 local_3bc0 [8];
  float fStack_3bb8;
  float fStack_3bb4;
  undefined8 uStack_3bb0;
  undefined8 uStack_3ba8;
  float local_3b20;
  float fStack_3b1c;
  float fStack_3b18;
  float fStack_3b14;
  float fStack_3b10;
  float fStack_3b0c;
  float fStack_3b08;
  float local_3ac0;
  float fStack_3abc;
  float fStack_3ab8;
  float fStack_3ab4;
  float fStack_3ab0;
  float fStack_3aac;
  float fStack_3aa8;
  float fStack_3aa4;
  undefined1 local_3a20 [8];
  float fStack_3a18;
  float fStack_3a14;
  float fStack_3a10;
  float fStack_3a0c;
  float fStack_3a08;
  float fStack_3a04;
  undefined1 local_39a0 [8];
  float fStack_3998;
  float fStack_3994;
  undefined8 uStack_3990;
  undefined8 uStack_3988;
  undefined1 local_3920 [8];
  float fStack_3918;
  float fStack_3914;
  undefined8 uStack_3910;
  undefined8 uStack_3908;
  float local_3900;
  float fStack_38fc;
  float fStack_38f8;
  float fStack_38f4;
  float fStack_38f0;
  float fStack_38ec;
  float fStack_38e8;
  float fStack_38e4;
  float local_38c0;
  float fStack_38bc;
  float fStack_38b8;
  float fStack_38b4;
  float fStack_38b0;
  float fStack_38ac;
  float fStack_38a8;
  float fStack_38a4;
  float local_38a0;
  float fStack_389c;
  float fStack_3898;
  float fStack_3894;
  float fStack_3890;
  float fStack_388c;
  float fStack_3888;
  float fStack_3884;
  float local_3860;
  float fStack_385c;
  float fStack_3858;
  float fStack_3854;
  float fStack_3850;
  float fStack_384c;
  float fStack_3848;
  float fStack_3844;
  undefined1 local_36c0 [8];
  float fStack_36b8;
  float fStack_36b4;
  float fStack_36b0;
  float fStack_36ac;
  float fStack_36a8;
  float fStack_36a4;
  undefined1 local_3640 [8];
  float fStack_3638;
  float fStack_3634;
  undefined8 uStack_3630;
  undefined8 uStack_3628;
  undefined1 local_35c0 [8];
  float fStack_35b8;
  float fStack_35b4;
  undefined8 uStack_35b0;
  undefined8 uStack_35a8;
  float local_35a0;
  float fStack_359c;
  float fStack_3598;
  float fStack_3594;
  float fStack_3590;
  float fStack_358c;
  float fStack_3588;
  float fStack_3584;
  float local_3560;
  float fStack_355c;
  float fStack_3558;
  float fStack_3554;
  float fStack_3550;
  float fStack_354c;
  float fStack_3548;
  float fStack_3544;
  float local_3540;
  float fStack_353c;
  float fStack_3538;
  float fStack_3534;
  float fStack_3530;
  float fStack_352c;
  float fStack_3528;
  float fStack_3524;
  float local_3500;
  float fStack_34fc;
  float fStack_34f8;
  float fStack_34f4;
  float fStack_34f0;
  float fStack_34ec;
  float fStack_34e8;
  float fStack_34e4;
  float local_31c0;
  float fStack_31bc;
  float fStack_31b8;
  float fStack_31b4;
  float fStack_31b0;
  float fStack_31ac;
  float fStack_31a8;
  float local_2b80;
  float fStack_2b7c;
  float fStack_2b78;
  float fStack_2b74;
  float fStack_2b70;
  float fStack_2b6c;
  float fStack_2b68;
  float local_2220;
  float fStack_221c;
  float fStack_2218;
  float fStack_2214;
  float fStack_2210;
  float fStack_220c;
  float fStack_2208;
  float local_1dc0;
  float fStack_1dbc;
  float fStack_1db8;
  float fStack_1db4;
  float fStack_1db0;
  float fStack_1dac;
  float fStack_1da8;
  float local_1940;
  float fStack_193c;
  float fStack_1938;
  float fStack_1934;
  float fStack_1930;
  float fStack_192c;
  float fStack_1928;
  float fStack_1924;
  float local_1800;
  float fStack_17fc;
  float fStack_17f8;
  float fStack_17f4;
  float fStack_17f0;
  float fStack_17ec;
  float fStack_17e8;
  float fStack_17e4;
  undefined8 local_f80;
  undefined8 uStack_f78;
  undefined8 local_e80;
  undefined8 uStack_e78;
  float local_cc0;
  float fStack_cbc;
  float fStack_cb8;
  float fStack_cb4;
  undefined8 local_c90;
  undefined8 uStack_c88;
  undefined8 local_c60;
  undefined8 uStack_c58;
  undefined8 local_c50;
  undefined8 uStack_c48;
  undefined8 local_c30;
  undefined8 uStack_c28;
  float local_bc0;
  float fStack_bbc;
  float fStack_bb8;
  float fStack_bb4;
  float local_b90;
  float fStack_b8c;
  float fStack_b88;
  float fStack_b84;
  float local_b70;
  float fStack_b6c;
  float fStack_b68;
  float fStack_b64;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  undefined8 local_aa0;
  undefined8 uStack_a98;
  undefined8 local_a60;
  undefined8 uStack_a58;
  float local_a50;
  float fStack_a4c;
  float fStack_a48;
  float fStack_a44;
  float local_a30;
  float fStack_a2c;
  float fStack_a28;
  float fStack_a24;
  float local_a20;
  float fStack_a1c;
  float fStack_a18;
  float fStack_a14;
  float local_a00;
  float fStack_9fc;
  float fStack_9f8;
  float fStack_9f4;
  float local_6e0;
  float fStack_6dc;
  float fStack_6d8;
  float fStack_6d4;
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  
  local_4208 = in_RDX;
  local_4200 = in_RSI;
  local_41f8 = in_RDI;
  if (in_R8D == 8) {
    for (local_4218 = 0; local_4218 < in_ECX; local_4218 = local_4218 + 1) {
      fVar63 = *local_4200;
      auVar3 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar63),0x20);
      auVar3 = vinsertps_avx(auVar3,ZEXT416((uint)fVar63),0x30);
      auVar4 = vinsertps_avx(ZEXT416((uint)fVar63),ZEXT416((uint)fVar63),0x10);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar63),0x20);
      auVar4 = vinsertps_avx(auVar4,ZEXT416((uint)fVar63),0x30);
      auVar1 = vcmpps_avx(*local_41f8,ZEXT1632(ZEXT816(0)),2);
      auVar6._8_8_ = 0x80000000800000;
      auVar6._0_8_ = 0x80000000800000;
      auVar6._16_8_ = 0x80000000800000;
      auVar6._24_8_ = 0x80000000800000;
      auVar5 = vmaxps_avx(*local_41f8,auVar6);
      auVar7 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
      auVar8 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
      auVar18._8_8_ = 0x807fffff807fffff;
      auVar18._0_8_ = 0x807fffff807fffff;
      auVar18._16_8_ = 0x807fffff807fffff;
      auVar18._24_8_ = 0x807fffff807fffff;
      auVar5 = vandps_avx(auVar5,auVar18);
      auVar34._8_8_ = 0x3f0000003f000000;
      auVar34._0_8_ = 0x3f0000003f000000;
      auVar34._16_8_ = 0x3f0000003f000000;
      auVar34._24_8_ = 0x3f0000003f000000;
      auVar6 = vorps_avx(auVar5,auVar34);
      auVar42._8_8_ = 0x7f0000007f;
      auVar42._0_8_ = 0x7f0000007f;
      auVar7 = vpsubd_avx(auVar7,auVar42);
      auVar41._8_8_ = 0x7f0000007f;
      auVar41._0_8_ = 0x7f0000007f;
      auVar8 = vpsubd_avx(auVar8,auVar41);
      local_f80 = auVar8._0_8_;
      uStack_f78 = auVar8._8_8_;
      auVar37._16_8_ = local_f80;
      auVar37._0_16_ = auVar7;
      auVar37._24_8_ = uStack_f78;
      auVar5 = vcvtdq2ps_avx(auVar37);
      local_3500 = auVar5._0_4_;
      fStack_34fc = auVar5._4_4_;
      fStack_34f8 = auVar5._8_4_;
      fStack_34f4 = auVar5._12_4_;
      fStack_34f0 = auVar5._16_4_;
      fStack_34ec = auVar5._20_4_;
      fStack_34e8 = auVar5._24_4_;
      fStack_34e4 = auVar5._28_4_;
      local_3640._4_4_ = fStack_34fc + 1.0;
      local_3640._0_4_ = local_3500 + 1.0;
      fStack_3638 = fStack_34f8 + 1.0;
      fStack_3634 = fStack_34f4 + 1.0;
      uStack_3630._0_4_ = fStack_34f0 + 1.0;
      uStack_3630._4_4_ = fStack_34ec + 1.0;
      uStack_3628._0_4_ = fStack_34e8 + 1.0;
      uStack_3628._4_4_ = fStack_34e4 + 1.0;
      auVar15 = _local_3640;
      auVar2 = vcmpps_avx(auVar6,_DAT_01f96920,1);
      auVar5 = vandps_avx(auVar6,auVar2);
      auVar16._8_8_ = 0x3f8000003f800000;
      auVar16._0_8_ = 0x3f8000003f800000;
      auVar16._16_8_ = 0x3f8000003f800000;
      auVar16._24_8_ = 0x3f8000003f800000;
      auVar6 = vsubps_avx(auVar6,auVar16);
      uStack_3628 = auVar15._24_8_;
      auVar17._8_8_ = 0x3f8000003f800000;
      auVar17._0_8_ = 0x3f8000003f800000;
      auVar17._16_8_ = 0x3f8000003f800000;
      auVar17._24_8_ = 0x3f8000003f800000;
      auVar2 = vandps_avx(auVar17,auVar2);
      auVar15._16_8_ = uStack_3630;
      auVar15._0_16_ = _local_3640;
      auVar15._24_8_ = uStack_3628;
      auVar2 = vsubps_avx(auVar15,auVar2);
      local_3540 = auVar6._0_4_;
      fStack_353c = auVar6._4_4_;
      fStack_3538 = auVar6._8_4_;
      fStack_3534 = auVar6._12_4_;
      fStack_3530 = auVar6._16_4_;
      fStack_352c = auVar6._20_4_;
      fStack_3528 = auVar6._24_4_;
      fStack_3524 = auVar6._28_4_;
      local_3560 = auVar5._0_4_;
      fStack_355c = auVar5._4_4_;
      fStack_3558 = auVar5._8_4_;
      fStack_3554 = auVar5._12_4_;
      fStack_3550 = auVar5._16_4_;
      fStack_354c = auVar5._20_4_;
      fStack_3548 = auVar5._24_4_;
      fStack_3544 = auVar5._28_4_;
      local_3540 = local_3540 + local_3560;
      fStack_353c = fStack_353c + fStack_355c;
      fStack_3538 = fStack_3538 + fStack_3558;
      fStack_3534 = fStack_3534 + fStack_3554;
      fStack_3530 = fStack_3530 + fStack_3550;
      fStack_352c = fStack_352c + fStack_354c;
      fStack_3528 = fStack_3528 + fStack_3548;
      fStack_3524 = fStack_3524 + fStack_3544;
      local_31c0 = auVar2._0_4_;
      fStack_31bc = auVar2._4_4_;
      fStack_31b8 = auVar2._8_4_;
      fStack_31b4 = auVar2._12_4_;
      fStack_31b0 = auVar2._16_4_;
      fStack_31ac = auVar2._20_4_;
      fStack_31a8 = auVar2._24_4_;
      local_36c0._4_4_ =
           fStack_31bc * -0.00021219444 +
           ((((((((fStack_353c * 0.070376836 + -0.1151461) * fStack_353c + 0.116769984) *
                 fStack_353c + -0.12420141) * fStack_353c + 0.14249323) * fStack_353c + -0.16668057)
              * fStack_353c + 0.20000714) * fStack_353c + -0.24999994) * fStack_353c + 0.3333333) *
           fStack_353c * fStack_353c * fStack_353c;
      local_36c0._0_4_ =
           local_31c0 * -0.00021219444 +
           ((((((((local_3540 * 0.070376836 + -0.1151461) * local_3540 + 0.116769984) * local_3540 +
                -0.12420141) * local_3540 + 0.14249323) * local_3540 + -0.16668057) * local_3540 +
             0.20000714) * local_3540 + -0.24999994) * local_3540 + 0.3333333) * local_3540 *
           local_3540 * local_3540;
      fStack_36b8 = fStack_31b8 * -0.00021219444 +
                    ((((((((fStack_3538 * 0.070376836 + -0.1151461) * fStack_3538 + 0.116769984) *
                          fStack_3538 + -0.12420141) * fStack_3538 + 0.14249323) * fStack_3538 +
                       -0.16668057) * fStack_3538 + 0.20000714) * fStack_3538 + -0.24999994) *
                     fStack_3538 + 0.3333333) * fStack_3538 * fStack_3538 * fStack_3538;
      fStack_36b4 = fStack_31b4 * -0.00021219444 +
                    ((((((((fStack_3534 * 0.070376836 + -0.1151461) * fStack_3534 + 0.116769984) *
                          fStack_3534 + -0.12420141) * fStack_3534 + 0.14249323) * fStack_3534 +
                       -0.16668057) * fStack_3534 + 0.20000714) * fStack_3534 + -0.24999994) *
                     fStack_3534 + 0.3333333) * fStack_3534 * fStack_3534 * fStack_3534;
      fStack_36b0 = fStack_31b0 * -0.00021219444 +
                    ((((((((fStack_3530 * 0.070376836 + -0.1151461) * fStack_3530 + 0.116769984) *
                          fStack_3530 + -0.12420141) * fStack_3530 + 0.14249323) * fStack_3530 +
                       -0.16668057) * fStack_3530 + 0.20000714) * fStack_3530 + -0.24999994) *
                     fStack_3530 + 0.3333333) * fStack_3530 * fStack_3530 * fStack_3530;
      fStack_36ac = fStack_31ac * -0.00021219444 +
                    ((((((((fStack_352c * 0.070376836 + -0.1151461) * fStack_352c + 0.116769984) *
                          fStack_352c + -0.12420141) * fStack_352c + 0.14249323) * fStack_352c +
                       -0.16668057) * fStack_352c + 0.20000714) * fStack_352c + -0.24999994) *
                     fStack_352c + 0.3333333) * fStack_352c * fStack_352c * fStack_352c;
      fStack_36a8 = fStack_31a8 * -0.00021219444 +
                    ((((((((fStack_3528 * 0.070376836 + -0.1151461) * fStack_3528 + 0.116769984) *
                          fStack_3528 + -0.12420141) * fStack_3528 + 0.14249323) * fStack_3528 +
                       -0.16668057) * fStack_3528 + 0.20000714) * fStack_3528 + -0.24999994) *
                     fStack_3528 + 0.3333333) * fStack_3528 * fStack_3528 * fStack_3528;
      fStack_36a4 = fStack_3524 + 0.3333333 + -0.00021219444;
      auVar23._4_4_ = fStack_353c * fStack_353c * 0.5;
      auVar23._0_4_ = local_3540 * local_3540 * 0.5;
      auVar23._8_4_ = fStack_3538 * fStack_3538 * 0.5;
      auVar23._12_4_ = fStack_3534 * fStack_3534 * 0.5;
      auVar23._16_4_ = fStack_3530 * fStack_3530 * 0.5;
      auVar23._20_4_ = fStack_352c * fStack_352c * 0.5;
      auVar23._24_4_ = fStack_3528 * fStack_3528 * 0.5;
      auVar23._28_4_ = fStack_3524;
      auVar5 = vsubps_avx(_local_36c0,auVar23);
      local_35a0 = auVar5._0_4_;
      fStack_359c = auVar5._4_4_;
      fStack_3598 = auVar5._8_4_;
      fStack_3594 = auVar5._12_4_;
      fStack_3590 = auVar5._16_4_;
      fStack_358c = auVar5._20_4_;
      fStack_3588 = auVar5._24_4_;
      fStack_3584 = auVar5._28_4_;
      local_35c0._4_4_ = fStack_31bc * 0.6933594 + fStack_353c + fStack_359c;
      local_35c0._0_4_ = local_31c0 * 0.6933594 + local_3540 + local_35a0;
      fStack_35b8 = fStack_31b8 * 0.6933594 + fStack_3538 + fStack_3598;
      fStack_35b4 = fStack_31b4 * 0.6933594 + fStack_3534 + fStack_3594;
      uStack_35b0._0_4_ = fStack_31b0 * 0.6933594 + fStack_3530 + fStack_3590;
      uStack_35b0._4_4_ = fStack_31ac * 0.6933594 + fStack_352c + fStack_358c;
      uStack_35a8._0_4_ = fStack_31a8 * 0.6933594 + fStack_3528 + fStack_3588;
      uStack_35a8._4_4_ = fStack_3524 + fStack_3584 + 0.6933594;
      auVar5 = _local_35c0;
      uStack_35a8 = auVar5._24_8_;
      auVar33._16_8_ = uStack_35b0;
      auVar33._0_16_ = _local_35c0;
      auVar33._24_8_ = uStack_35a8;
      auVar5 = vorps_avx(auVar33,auVar1);
      local_3fc0 = auVar3._0_4_;
      fStack_3fbc = auVar3._4_4_;
      fStack_3fb8 = auVar3._8_4_;
      fStack_3fb4 = auVar3._12_4_;
      fStack_3fb0 = auVar4._0_4_;
      fStack_3fac = auVar4._4_4_;
      fStack_3fa8 = auVar4._8_4_;
      uStack_3fa4 = auVar4._12_4_;
      local_3fe0 = auVar5._0_4_;
      fStack_3fdc = auVar5._4_4_;
      fStack_3fd8 = auVar5._8_4_;
      fStack_3fd4 = auVar5._12_4_;
      fStack_3fd0 = auVar5._16_4_;
      fStack_3fcc = auVar5._20_4_;
      fStack_3fc8 = auVar5._24_4_;
      local_3bc0._4_4_ = fStack_3fbc * fStack_3fdc;
      local_3bc0._0_4_ = local_3fc0 * local_3fe0;
      fStack_3bb8 = fStack_3fb8 * fStack_3fd8;
      fStack_3bb4 = fStack_3fb4 * fStack_3fd4;
      uStack_3bb0._0_4_ = fStack_3fb0 * fStack_3fd0;
      uStack_3bb0._4_4_ = fStack_3fac * fStack_3fcc;
      uStack_3ba8._0_4_ = fStack_3fa8 * fStack_3fc8;
      uStack_3ba8._4_4_ = uStack_3fa4;
      auVar5 = _local_3bc0;
      uStack_3ba8 = auVar5._24_8_;
      auVar1._16_8_ = uStack_3bb0;
      auVar1._0_16_ = _local_3bc0;
      auVar1._24_8_ = uStack_3ba8;
      auVar5._8_8_ = 0x42b0c0a542b0c0a5;
      auVar5._0_8_ = 0x42b0c0a542b0c0a5;
      auVar5._16_8_ = 0x42b0c0a542b0c0a5;
      auVar5._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar1,auVar5);
      auVar2._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar5,auVar2);
      local_2220 = auVar2._0_4_;
      fStack_221c = auVar2._4_4_;
      fStack_2218 = auVar2._8_4_;
      fStack_2214 = auVar2._12_4_;
      fStack_2210 = auVar2._16_4_;
      fStack_220c = auVar2._20_4_;
      fStack_2208 = auVar2._24_4_;
      local_3c00._4_4_ = fStack_221c * 1.442695 + 0.5;
      local_3c00._0_4_ = local_2220 * 1.442695 + 0.5;
      fStack_3bf8 = fStack_2218 * 1.442695 + 0.5;
      fStack_3bf4 = fStack_2214 * 1.442695 + 0.5;
      fStack_3bf0 = fStack_2210 * 1.442695 + 0.5;
      fStack_3bec = fStack_220c * 1.442695 + 0.5;
      fStack_3be8 = fStack_2208 * 1.442695 + 0.5;
      uStack_3be4 = 0x3ff8aa3b;
      auVar1 = vroundps_avx(_local_3c00,1);
      auVar5 = vcmpps_avx(_local_3c00,auVar1,1);
      auVar21._8_8_ = 0x3f8000003f800000;
      auVar21._0_8_ = 0x3f8000003f800000;
      auVar21._16_8_ = 0x3f8000003f800000;
      auVar21._24_8_ = 0x3f8000003f800000;
      auVar5 = vandps_avx(auVar5,auVar21);
      auVar5 = vsubps_avx(auVar1,auVar5);
      local_1940 = auVar5._0_4_;
      fStack_193c = auVar5._4_4_;
      fStack_1938 = auVar5._8_4_;
      fStack_1934 = auVar5._12_4_;
      fStack_1930 = auVar5._16_4_;
      fStack_192c = auVar5._20_4_;
      fStack_1928 = auVar5._24_4_;
      fStack_1924 = auVar5._28_4_;
      auVar26._4_4_ = fStack_193c * 0.6933594;
      auVar26._0_4_ = local_1940 * 0.6933594;
      auVar26._8_4_ = fStack_1938 * 0.6933594;
      auVar26._12_4_ = fStack_1934 * 0.6933594;
      auVar26._16_4_ = fStack_1930 * 0.6933594;
      auVar26._20_4_ = fStack_192c * 0.6933594;
      auVar26._24_4_ = fStack_1928 * 0.6933594;
      auVar26._28_4_ = fStack_1924;
      auVar5 = vsubps_avx(auVar2,auVar26);
      auVar25._4_4_ = fStack_193c * -0.00021219444;
      auVar25._0_4_ = local_1940 * -0.00021219444;
      auVar25._8_4_ = fStack_1938 * -0.00021219444;
      auVar25._12_4_ = fStack_1934 * -0.00021219444;
      auVar25._16_4_ = fStack_1930 * -0.00021219444;
      auVar25._20_4_ = fStack_192c * -0.00021219444;
      auVar25._24_4_ = fStack_1928 * -0.00021219444;
      auVar25._28_4_ = fStack_1924;
      auVar5 = vsubps_avx(auVar5,auVar25);
      local_3ac0 = auVar5._0_4_;
      fStack_3abc = auVar5._4_4_;
      fStack_3ab8 = auVar5._8_4_;
      fStack_3ab4 = auVar5._12_4_;
      fStack_3ab0 = auVar5._16_4_;
      fStack_3aac = auVar5._20_4_;
      fStack_3aa8 = auVar5._24_4_;
      fStack_3aa4 = auVar5._28_4_;
      local_3c20 = CONCAT44((int)fStack_193c,(int)local_1940);
      uStack_3c18 = CONCAT44((int)fStack_1934,(int)fStack_1938);
      uStack_3c10 = CONCAT44((int)fStack_192c,(int)fStack_1930);
      uStack_3c08 = CONCAT44((int)fStack_1924,(int)fStack_1928);
      auVar8._8_8_ = uStack_3c18;
      auVar8._0_8_ = local_3c20;
      auVar3._8_8_ = 0x7f0000007f;
      auVar3._0_8_ = 0x7f0000007f;
      auVar3 = vpaddd_avx(auVar8,auVar3);
      auVar7._8_8_ = uStack_3c08;
      auVar7._0_8_ = uStack_3c10;
      auVar4._8_8_ = 0x7f0000007f;
      auVar4._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar7,auVar4);
      auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      local_3b20 = auVar3._0_4_;
      fStack_3b1c = auVar3._4_4_;
      fStack_3b18 = auVar3._8_4_;
      fStack_3b14 = auVar3._12_4_;
      fStack_3b10 = auVar4._0_4_;
      fStack_3b0c = auVar4._4_4_;
      fStack_3b08 = auVar4._8_4_;
      local_3c80 = CONCAT44(((((((fStack_3abc * 0.00019875691 + 0.0013981999) * fStack_3abc +
                                0.008333452) * fStack_3abc + 0.041665796) * fStack_3abc + 0.16666666
                              ) * fStack_3abc + 0.5) * fStack_3abc * fStack_3abc + fStack_3abc + 1.0
                            ) * fStack_3b1c,
                            ((((((local_3ac0 * 0.00019875691 + 0.0013981999) * local_3ac0 +
                                0.008333452) * local_3ac0 + 0.041665796) * local_3ac0 + 0.16666666)
                              * local_3ac0 + 0.5) * local_3ac0 * local_3ac0 + local_3ac0 + 1.0) *
                            local_3b20);
      uStack_3c78 = CONCAT44(((((((fStack_3ab4 * 0.00019875691 + 0.0013981999) * fStack_3ab4 +
                                 0.008333452) * fStack_3ab4 + 0.041665796) * fStack_3ab4 +
                               0.16666666) * fStack_3ab4 + 0.5) * fStack_3ab4 * fStack_3ab4 +
                              fStack_3ab4 + 1.0) * fStack_3b14,
                             ((((((fStack_3ab8 * 0.00019875691 + 0.0013981999) * fStack_3ab8 +
                                 0.008333452) * fStack_3ab8 + 0.041665796) * fStack_3ab8 +
                               0.16666666) * fStack_3ab8 + 0.5) * fStack_3ab8 * fStack_3ab8 +
                              fStack_3ab8 + 1.0) * fStack_3b18);
      uStack_3c70 = CONCAT44(((((((fStack_3aac * 0.00019875691 + 0.0013981999) * fStack_3aac +
                                 0.008333452) * fStack_3aac + 0.041665796) * fStack_3aac +
                               0.16666666) * fStack_3aac + 0.5) * fStack_3aac * fStack_3aac +
                              fStack_3aac + 1.0) * fStack_3b0c,
                             ((((((fStack_3ab0 * 0.00019875691 + 0.0013981999) * fStack_3ab0 +
                                 0.008333452) * fStack_3ab0 + 0.041665796) * fStack_3ab0 +
                               0.16666666) * fStack_3ab0 + 0.5) * fStack_3ab0 * fStack_3ab0 +
                              fStack_3ab0 + 1.0) * fStack_3b10);
      uStack_3c68 = CONCAT44(fStack_3aa4 + fStack_3aa4 + 1.0,
                             ((((((fStack_3aa8 * 0.00019875691 + 0.0013981999) * fStack_3aa8 +
                                 0.008333452) * fStack_3aa8 + 0.041665796) * fStack_3aa8 +
                               0.16666666) * fStack_3aa8 + 0.5) * fStack_3aa8 * fStack_3aa8 +
                              fStack_3aa8 + 1.0) * fStack_3b08);
      *local_4208 = local_3c80;
      local_4208[1] = uStack_3c78;
      local_4208[2] = uStack_3c70;
      local_4208[3] = uStack_3c68;
      local_41f8 = local_41f8 + 1;
      local_4200 = local_4200 + 1;
      local_4208 = local_4208 + 4;
    }
  }
  if (in_R8D == 4) {
    for (local_4284 = 0; local_4284 + 1 < in_ECX; local_4284 = local_4284 + 2) {
      fVar63 = *local_4200;
      uStack_3e28._4_4_ = local_4200[1];
      auVar1 = vcmpps_avx(*local_41f8,ZEXT1632(ZEXT816(0)),2);
      auVar14._8_8_ = 0x80000000800000;
      auVar14._0_8_ = 0x80000000800000;
      auVar14._16_8_ = 0x80000000800000;
      auVar14._24_8_ = 0x80000000800000;
      auVar5 = vmaxps_avx(*local_41f8,auVar14);
      auVar3 = vpsrld_avx(auVar5._0_16_,ZEXT416(0x17));
      auVar4 = vpsrld_avx(auVar5._16_16_,ZEXT416(0x17));
      auVar20._8_8_ = 0x807fffff807fffff;
      auVar20._0_8_ = 0x807fffff807fffff;
      auVar20._16_8_ = 0x807fffff807fffff;
      auVar20._24_8_ = 0x807fffff807fffff;
      auVar5 = vandps_avx(auVar5,auVar20);
      auVar36._8_8_ = 0x3f0000003f000000;
      auVar36._0_8_ = 0x3f0000003f000000;
      auVar36._16_8_ = 0x3f0000003f000000;
      auVar36._24_8_ = 0x3f0000003f000000;
      auVar6 = vorps_avx(auVar5,auVar36);
      auVar40._8_8_ = 0x7f0000007f;
      auVar40._0_8_ = 0x7f0000007f;
      auVar3 = vpsubd_avx(auVar3,auVar40);
      auVar39._8_8_ = 0x7f0000007f;
      auVar39._0_8_ = 0x7f0000007f;
      auVar4 = vpsubd_avx(auVar4,auVar39);
      local_e80 = auVar4._0_8_;
      uStack_e78 = auVar4._8_8_;
      auVar38._16_8_ = local_e80;
      auVar38._0_16_ = auVar3;
      auVar38._24_8_ = uStack_e78;
      auVar5 = vcvtdq2ps_avx(auVar38);
      local_3860 = auVar5._0_4_;
      fStack_385c = auVar5._4_4_;
      fStack_3858 = auVar5._8_4_;
      fStack_3854 = auVar5._12_4_;
      fStack_3850 = auVar5._16_4_;
      fStack_384c = auVar5._20_4_;
      fStack_3848 = auVar5._24_4_;
      fStack_3844 = auVar5._28_4_;
      local_39a0._4_4_ = fStack_385c + 1.0;
      local_39a0._0_4_ = local_3860 + 1.0;
      fStack_3998 = fStack_3858 + 1.0;
      fStack_3994 = fStack_3854 + 1.0;
      uStack_3990._0_4_ = fStack_3850 + 1.0;
      uStack_3990._4_4_ = fStack_384c + 1.0;
      uStack_3988._0_4_ = fStack_3848 + 1.0;
      uStack_3988._4_4_ = fStack_3844 + 1.0;
      auVar15 = _local_39a0;
      auVar2 = vcmpps_avx(auVar6,_DAT_01f96920,1);
      auVar5 = vandps_avx(auVar6,auVar2);
      auVar13._8_8_ = 0x3f8000003f800000;
      auVar13._0_8_ = 0x3f8000003f800000;
      auVar13._16_8_ = 0x3f8000003f800000;
      auVar13._24_8_ = 0x3f8000003f800000;
      auVar6 = vsubps_avx(auVar6,auVar13);
      uStack_3988 = auVar15._24_8_;
      auVar19._8_8_ = 0x3f8000003f800000;
      auVar19._0_8_ = 0x3f8000003f800000;
      auVar19._16_8_ = 0x3f8000003f800000;
      auVar19._24_8_ = 0x3f8000003f800000;
      auVar2 = vandps_avx(auVar19,auVar2);
      auVar12._16_8_ = uStack_3990;
      auVar12._0_16_ = _local_39a0;
      auVar12._24_8_ = uStack_3988;
      auVar2 = vsubps_avx(auVar12,auVar2);
      local_38a0 = auVar6._0_4_;
      fStack_389c = auVar6._4_4_;
      fStack_3898 = auVar6._8_4_;
      fStack_3894 = auVar6._12_4_;
      fStack_3890 = auVar6._16_4_;
      fStack_388c = auVar6._20_4_;
      fStack_3888 = auVar6._24_4_;
      fStack_3884 = auVar6._28_4_;
      local_38c0 = auVar5._0_4_;
      fStack_38bc = auVar5._4_4_;
      fStack_38b8 = auVar5._8_4_;
      fStack_38b4 = auVar5._12_4_;
      fStack_38b0 = auVar5._16_4_;
      fStack_38ac = auVar5._20_4_;
      fStack_38a8 = auVar5._24_4_;
      fStack_38a4 = auVar5._28_4_;
      local_38a0 = local_38a0 + local_38c0;
      fStack_389c = fStack_389c + fStack_38bc;
      fStack_3898 = fStack_3898 + fStack_38b8;
      fStack_3894 = fStack_3894 + fStack_38b4;
      fStack_3890 = fStack_3890 + fStack_38b0;
      fStack_388c = fStack_388c + fStack_38ac;
      fStack_3888 = fStack_3888 + fStack_38a8;
      fStack_3884 = fStack_3884 + fStack_38a4;
      local_2b80 = auVar2._0_4_;
      fStack_2b7c = auVar2._4_4_;
      fStack_2b78 = auVar2._8_4_;
      fStack_2b74 = auVar2._12_4_;
      fStack_2b70 = auVar2._16_4_;
      fStack_2b6c = auVar2._20_4_;
      fStack_2b68 = auVar2._24_4_;
      local_3a20._4_4_ =
           fStack_2b7c * -0.00021219444 +
           ((((((((fStack_389c * 0.070376836 + -0.1151461) * fStack_389c + 0.116769984) *
                 fStack_389c + -0.12420141) * fStack_389c + 0.14249323) * fStack_389c + -0.16668057)
              * fStack_389c + 0.20000714) * fStack_389c + -0.24999994) * fStack_389c + 0.3333333) *
           fStack_389c * fStack_389c * fStack_389c;
      local_3a20._0_4_ =
           local_2b80 * -0.00021219444 +
           ((((((((local_38a0 * 0.070376836 + -0.1151461) * local_38a0 + 0.116769984) * local_38a0 +
                -0.12420141) * local_38a0 + 0.14249323) * local_38a0 + -0.16668057) * local_38a0 +
             0.20000714) * local_38a0 + -0.24999994) * local_38a0 + 0.3333333) * local_38a0 *
           local_38a0 * local_38a0;
      fStack_3a18 = fStack_2b78 * -0.00021219444 +
                    ((((((((fStack_3898 * 0.070376836 + -0.1151461) * fStack_3898 + 0.116769984) *
                          fStack_3898 + -0.12420141) * fStack_3898 + 0.14249323) * fStack_3898 +
                       -0.16668057) * fStack_3898 + 0.20000714) * fStack_3898 + -0.24999994) *
                     fStack_3898 + 0.3333333) * fStack_3898 * fStack_3898 * fStack_3898;
      fStack_3a14 = fStack_2b74 * -0.00021219444 +
                    ((((((((fStack_3894 * 0.070376836 + -0.1151461) * fStack_3894 + 0.116769984) *
                          fStack_3894 + -0.12420141) * fStack_3894 + 0.14249323) * fStack_3894 +
                       -0.16668057) * fStack_3894 + 0.20000714) * fStack_3894 + -0.24999994) *
                     fStack_3894 + 0.3333333) * fStack_3894 * fStack_3894 * fStack_3894;
      fStack_3a10 = fStack_2b70 * -0.00021219444 +
                    ((((((((fStack_3890 * 0.070376836 + -0.1151461) * fStack_3890 + 0.116769984) *
                          fStack_3890 + -0.12420141) * fStack_3890 + 0.14249323) * fStack_3890 +
                       -0.16668057) * fStack_3890 + 0.20000714) * fStack_3890 + -0.24999994) *
                     fStack_3890 + 0.3333333) * fStack_3890 * fStack_3890 * fStack_3890;
      fStack_3a0c = fStack_2b6c * -0.00021219444 +
                    ((((((((fStack_388c * 0.070376836 + -0.1151461) * fStack_388c + 0.116769984) *
                          fStack_388c + -0.12420141) * fStack_388c + 0.14249323) * fStack_388c +
                       -0.16668057) * fStack_388c + 0.20000714) * fStack_388c + -0.24999994) *
                     fStack_388c + 0.3333333) * fStack_388c * fStack_388c * fStack_388c;
      fStack_3a08 = fStack_2b68 * -0.00021219444 +
                    ((((((((fStack_3888 * 0.070376836 + -0.1151461) * fStack_3888 + 0.116769984) *
                          fStack_3888 + -0.12420141) * fStack_3888 + 0.14249323) * fStack_3888 +
                       -0.16668057) * fStack_3888 + 0.20000714) * fStack_3888 + -0.24999994) *
                     fStack_3888 + 0.3333333) * fStack_3888 * fStack_3888 * fStack_3888;
      fStack_3a04 = fStack_3884 + 0.3333333 + -0.00021219444;
      auVar24._4_4_ = fStack_389c * fStack_389c * 0.5;
      auVar24._0_4_ = local_38a0 * local_38a0 * 0.5;
      auVar24._8_4_ = fStack_3898 * fStack_3898 * 0.5;
      auVar24._12_4_ = fStack_3894 * fStack_3894 * 0.5;
      auVar24._16_4_ = fStack_3890 * fStack_3890 * 0.5;
      auVar24._20_4_ = fStack_388c * fStack_388c * 0.5;
      auVar24._24_4_ = fStack_3888 * fStack_3888 * 0.5;
      auVar24._28_4_ = fStack_3884;
      auVar5 = vsubps_avx(_local_3a20,auVar24);
      local_3900 = auVar5._0_4_;
      fStack_38fc = auVar5._4_4_;
      fStack_38f8 = auVar5._8_4_;
      fStack_38f4 = auVar5._12_4_;
      fStack_38f0 = auVar5._16_4_;
      fStack_38ec = auVar5._20_4_;
      fStack_38e8 = auVar5._24_4_;
      fStack_38e4 = auVar5._28_4_;
      local_3920._4_4_ = fStack_2b7c * 0.6933594 + fStack_389c + fStack_38fc;
      local_3920._0_4_ = local_2b80 * 0.6933594 + local_38a0 + local_3900;
      fStack_3918 = fStack_2b78 * 0.6933594 + fStack_3898 + fStack_38f8;
      fStack_3914 = fStack_2b74 * 0.6933594 + fStack_3894 + fStack_38f4;
      uStack_3910._0_4_ = fStack_2b70 * 0.6933594 + fStack_3890 + fStack_38f0;
      uStack_3910._4_4_ = fStack_2b6c * 0.6933594 + fStack_388c + fStack_38ec;
      uStack_3908._0_4_ = fStack_2b68 * 0.6933594 + fStack_3888 + fStack_38e8;
      uStack_3908._4_4_ = fStack_3884 + fStack_38e4 + 0.6933594;
      auVar5 = _local_3920;
      uStack_3908 = auVar5._24_8_;
      auVar35._16_8_ = uStack_3910;
      auVar35._0_16_ = _local_3920;
      auVar35._24_8_ = uStack_3908;
      auVar5 = vorps_avx(auVar35,auVar1);
      local_3f60 = auVar5._0_4_;
      fStack_3f5c = auVar5._4_4_;
      fStack_3f58 = auVar5._8_4_;
      fStack_3f54 = auVar5._12_4_;
      fStack_3f50 = auVar5._16_4_;
      fStack_3f4c = auVar5._20_4_;
      fStack_3f48 = auVar5._24_4_;
      local_3e40._4_4_ = fVar63 * fStack_3f5c;
      local_3e40._0_4_ = fVar63 * local_3f60;
      fStack_3e38 = fVar63 * fStack_3f58;
      fStack_3e34 = fVar63 * fStack_3f54;
      uStack_3e30._0_4_ = uStack_3e28._4_4_ * fStack_3f50;
      uStack_3e30._4_4_ = uStack_3e28._4_4_ * fStack_3f4c;
      uStack_3e28._0_4_ = uStack_3e28._4_4_ * fStack_3f48;
      auVar5 = _local_3e40;
      uStack_3e28 = auVar5._24_8_;
      auVar11._16_8_ = uStack_3e30;
      auVar11._0_16_ = _local_3e40;
      auVar11._24_8_ = uStack_3e28;
      auVar10._8_8_ = 0x42b0c0a542b0c0a5;
      auVar10._0_8_ = 0x42b0c0a542b0c0a5;
      auVar10._16_8_ = 0x42b0c0a542b0c0a5;
      auVar10._24_8_ = 0x42b0c0a542b0c0a5;
      auVar5 = vminps_avx(auVar11,auVar10);
      auVar9._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9._16_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar9._24_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar2 = vmaxps_avx(auVar5,auVar9);
      local_1dc0 = auVar2._0_4_;
      fStack_1dbc = auVar2._4_4_;
      fStack_1db8 = auVar2._8_4_;
      fStack_1db4 = auVar2._12_4_;
      fStack_1db0 = auVar2._16_4_;
      fStack_1dac = auVar2._20_4_;
      fStack_1da8 = auVar2._24_4_;
      local_3e80._4_4_ = fStack_1dbc * 1.442695 + 0.5;
      local_3e80._0_4_ = local_1dc0 * 1.442695 + 0.5;
      fStack_3e78 = fStack_1db8 * 1.442695 + 0.5;
      fStack_3e74 = fStack_1db4 * 1.442695 + 0.5;
      fStack_3e70 = fStack_1db0 * 1.442695 + 0.5;
      fStack_3e6c = fStack_1dac * 1.442695 + 0.5;
      fStack_3e68 = fStack_1da8 * 1.442695 + 0.5;
      uStack_3e64 = 0x3ff8aa3b;
      auVar1 = vroundps_avx(_local_3e80,1);
      auVar5 = vcmpps_avx(_local_3e80,auVar1,1);
      auVar22._8_8_ = 0x3f8000003f800000;
      auVar22._0_8_ = 0x3f8000003f800000;
      auVar22._16_8_ = 0x3f8000003f800000;
      auVar22._24_8_ = 0x3f8000003f800000;
      auVar5 = vandps_avx(auVar5,auVar22);
      auVar5 = vsubps_avx(auVar1,auVar5);
      local_1800 = auVar5._0_4_;
      fStack_17fc = auVar5._4_4_;
      fStack_17f8 = auVar5._8_4_;
      fStack_17f4 = auVar5._12_4_;
      fStack_17f0 = auVar5._16_4_;
      fStack_17ec = auVar5._20_4_;
      fStack_17e8 = auVar5._24_4_;
      fStack_17e4 = auVar5._28_4_;
      auVar28._4_4_ = fStack_17fc * 0.6933594;
      auVar28._0_4_ = local_1800 * 0.6933594;
      auVar28._8_4_ = fStack_17f8 * 0.6933594;
      auVar28._12_4_ = fStack_17f4 * 0.6933594;
      auVar28._16_4_ = fStack_17f0 * 0.6933594;
      auVar28._20_4_ = fStack_17ec * 0.6933594;
      auVar28._24_4_ = fStack_17e8 * 0.6933594;
      auVar28._28_4_ = fStack_17e4;
      auVar5 = vsubps_avx(auVar2,auVar28);
      auVar27._4_4_ = fStack_17fc * -0.00021219444;
      auVar27._0_4_ = local_1800 * -0.00021219444;
      auVar27._8_4_ = fStack_17f8 * -0.00021219444;
      auVar27._12_4_ = fStack_17f4 * -0.00021219444;
      auVar27._16_4_ = fStack_17f0 * -0.00021219444;
      auVar27._20_4_ = fStack_17ec * -0.00021219444;
      auVar27._24_4_ = fStack_17e8 * -0.00021219444;
      auVar27._28_4_ = fStack_17e4;
      auVar5 = vsubps_avx(auVar5,auVar27);
      local_3d40 = auVar5._0_4_;
      fStack_3d3c = auVar5._4_4_;
      fStack_3d38 = auVar5._8_4_;
      fStack_3d34 = auVar5._12_4_;
      fStack_3d30 = auVar5._16_4_;
      fStack_3d2c = auVar5._20_4_;
      fStack_3d28 = auVar5._24_4_;
      fStack_3d24 = auVar5._28_4_;
      local_3ea0 = CONCAT44((int)fStack_17fc,(int)local_1800);
      uStack_3e98 = CONCAT44((int)fStack_17f4,(int)fStack_17f8);
      uStack_3e90 = CONCAT44((int)fStack_17ec,(int)fStack_17f0);
      uStack_3e88 = CONCAT44((int)fStack_17e4,(int)fStack_17e8);
      auVar32._8_8_ = uStack_3e98;
      auVar32._0_8_ = local_3ea0;
      auVar31._8_8_ = 0x7f0000007f;
      auVar31._0_8_ = 0x7f0000007f;
      auVar3 = vpaddd_avx(auVar32,auVar31);
      auVar30._8_8_ = uStack_3e88;
      auVar30._0_8_ = uStack_3e90;
      auVar29._8_8_ = 0x7f0000007f;
      auVar29._0_8_ = 0x7f0000007f;
      auVar4 = vpaddd_avx(auVar30,auVar29);
      auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
      auVar4 = vpslld_avx(auVar4,ZEXT416(0x17));
      local_3da0 = auVar3._0_4_;
      fStack_3d9c = auVar3._4_4_;
      fStack_3d98 = auVar3._8_4_;
      fStack_3d94 = auVar3._12_4_;
      fStack_3d90 = auVar4._0_4_;
      fStack_3d8c = auVar4._4_4_;
      fStack_3d88 = auVar4._8_4_;
      local_3f00 = CONCAT44(((((((fStack_3d3c * 0.00019875691 + 0.0013981999) * fStack_3d3c +
                                0.008333452) * fStack_3d3c + 0.041665796) * fStack_3d3c + 0.16666666
                              ) * fStack_3d3c + 0.5) * fStack_3d3c * fStack_3d3c + fStack_3d3c + 1.0
                            ) * fStack_3d9c,
                            ((((((local_3d40 * 0.00019875691 + 0.0013981999) * local_3d40 +
                                0.008333452) * local_3d40 + 0.041665796) * local_3d40 + 0.16666666)
                              * local_3d40 + 0.5) * local_3d40 * local_3d40 + local_3d40 + 1.0) *
                            local_3da0);
      uStack_3ef8 = CONCAT44(((((((fStack_3d34 * 0.00019875691 + 0.0013981999) * fStack_3d34 +
                                 0.008333452) * fStack_3d34 + 0.041665796) * fStack_3d34 +
                               0.16666666) * fStack_3d34 + 0.5) * fStack_3d34 * fStack_3d34 +
                              fStack_3d34 + 1.0) * fStack_3d94,
                             ((((((fStack_3d38 * 0.00019875691 + 0.0013981999) * fStack_3d38 +
                                 0.008333452) * fStack_3d38 + 0.041665796) * fStack_3d38 +
                               0.16666666) * fStack_3d38 + 0.5) * fStack_3d38 * fStack_3d38 +
                              fStack_3d38 + 1.0) * fStack_3d98);
      uStack_3ef0 = CONCAT44(((((((fStack_3d2c * 0.00019875691 + 0.0013981999) * fStack_3d2c +
                                 0.008333452) * fStack_3d2c + 0.041665796) * fStack_3d2c +
                               0.16666666) * fStack_3d2c + 0.5) * fStack_3d2c * fStack_3d2c +
                              fStack_3d2c + 1.0) * fStack_3d8c,
                             ((((((fStack_3d30 * 0.00019875691 + 0.0013981999) * fStack_3d30 +
                                 0.008333452) * fStack_3d30 + 0.041665796) * fStack_3d30 +
                               0.16666666) * fStack_3d30 + 0.5) * fStack_3d30 * fStack_3d30 +
                              fStack_3d30 + 1.0) * fStack_3d90);
      uStack_3ee8 = CONCAT44(fStack_3d24 + fStack_3d24 + 1.0,
                             ((((((fStack_3d28 * 0.00019875691 + 0.0013981999) * fStack_3d28 +
                                 0.008333452) * fStack_3d28 + 0.041665796) * fStack_3d28 +
                               0.16666666) * fStack_3d28 + 0.5) * fStack_3d28 * fStack_3d28 +
                              fStack_3d28 + 1.0) * fStack_3d88);
      *local_4208 = local_3f00;
      local_4208[1] = uStack_3ef8;
      local_4208[2] = uStack_3ef0;
      local_4208[3] = uStack_3ee8;
      local_41f8 = local_41f8 + 1;
      local_4200 = local_4200 + 2;
      local_4208 = local_4208 + 4;
    }
    for (; local_4284 < in_ECX; local_4284 = local_4284 + 1) {
      fVar63 = *local_4200;
      auVar3 = vcmpps_avx(*(undefined1 (*) [16])*local_41f8,ZEXT816(0),2);
      auVar50._8_8_ = 0x80000000800000;
      auVar50._0_8_ = 0x80000000800000;
      auVar4 = vmaxps_avx(*(undefined1 (*) [16])*local_41f8,auVar50);
      auVar7 = vpsrld_avx(auVar4,ZEXT416(0x17));
      auVar55._8_8_ = 0x807fffff807fffff;
      auVar55._0_8_ = 0x807fffff807fffff;
      auVar4 = vpand_avx(auVar4,auVar55);
      auVar61._8_8_ = 0x3f0000003f000000;
      auVar61._0_8_ = 0x3f0000003f000000;
      auVar8 = vpor_avx(auVar4,auVar61);
      auVar51._8_8_ = 0x7f0000007f;
      auVar51._0_8_ = 0x7f0000007f;
      auVar4 = vpsubd_avx(auVar7,auVar51);
      auVar4 = vcvtdq2ps_avx(auVar4);
      local_a00 = auVar4._0_4_;
      fStack_9fc = auVar4._4_4_;
      fStack_9f8 = auVar4._8_4_;
      fStack_9f4 = auVar4._12_4_;
      local_aa0 = CONCAT44(fStack_9fc + 1.0,local_a00 + 1.0);
      uStack_a98._0_4_ = fStack_9f8 + 1.0;
      uStack_a98._4_4_ = fStack_9f4 + 1.0;
      auVar62._8_8_ = 0x3f3504f33f3504f3;
      auVar62._0_8_ = 0x3f3504f33f3504f3;
      auVar4 = vcmpps_avx(auVar8,auVar62,1);
      auVar7 = vpand_avx(auVar8,auVar4);
      auVar49._8_8_ = 0x3f8000003f800000;
      auVar49._0_8_ = 0x3f8000003f800000;
      auVar8 = vsubps_avx(auVar8,auVar49);
      auVar54._8_8_ = 0x3f8000003f800000;
      auVar54._0_8_ = 0x3f8000003f800000;
      auVar4 = vpand_avx(auVar54,auVar4);
      auVar48._8_8_ = uStack_a98;
      auVar48._0_8_ = local_aa0;
      auVar4 = vsubps_avx(auVar48,auVar4);
      local_a20 = auVar8._0_4_;
      fStack_a1c = auVar8._4_4_;
      fStack_a18 = auVar8._8_4_;
      fStack_a14 = auVar8._12_4_;
      local_a30 = auVar7._0_4_;
      fStack_a2c = auVar7._4_4_;
      fStack_a28 = auVar7._8_4_;
      fStack_a24 = auVar7._12_4_;
      local_a20 = local_a20 + local_a30;
      fStack_a1c = fStack_a1c + fStack_a2c;
      fStack_a18 = fStack_a18 + fStack_a28;
      fStack_a14 = fStack_a14 + fStack_a24;
      local_620 = auVar4._0_4_;
      fStack_61c = auVar4._4_4_;
      fStack_618 = auVar4._8_4_;
      fStack_614 = auVar4._12_4_;
      local_ae0._4_4_ =
           fStack_61c * -0.00021219444 +
           ((((((((fStack_a1c * 0.070376836 + -0.1151461) * fStack_a1c + 0.116769984) * fStack_a1c +
                -0.12420141) * fStack_a1c + 0.14249323) * fStack_a1c + -0.16668057) * fStack_a1c +
             0.20000714) * fStack_a1c + -0.24999994) * fStack_a1c + 0.3333333) * fStack_a1c *
           fStack_a1c * fStack_a1c;
      local_ae0._0_4_ =
           local_620 * -0.00021219444 +
           ((((((((local_a20 * 0.070376836 + -0.1151461) * local_a20 + 0.116769984) * local_a20 +
                -0.12420141) * local_a20 + 0.14249323) * local_a20 + -0.16668057) * local_a20 +
             0.20000714) * local_a20 + -0.24999994) * local_a20 + 0.3333333) * local_a20 *
           local_a20 * local_a20;
      fStack_ad8 = fStack_618 * -0.00021219444 +
                   ((((((((fStack_a18 * 0.070376836 + -0.1151461) * fStack_a18 + 0.116769984) *
                         fStack_a18 + -0.12420141) * fStack_a18 + 0.14249323) * fStack_a18 +
                      -0.16668057) * fStack_a18 + 0.20000714) * fStack_a18 + -0.24999994) *
                    fStack_a18 + 0.3333333) * fStack_a18 * fStack_a18 * fStack_a18;
      fStack_ad4 = fStack_614 * -0.00021219444 +
                   ((((((((fStack_a14 * 0.070376836 + -0.1151461) * fStack_a14 + 0.116769984) *
                         fStack_a14 + -0.12420141) * fStack_a14 + 0.14249323) * fStack_a14 +
                      -0.16668057) * fStack_a14 + 0.20000714) * fStack_a14 + -0.24999994) *
                    fStack_a14 + 0.3333333) * fStack_a14 * fStack_a14 * fStack_a14;
      auVar57._4_4_ = fStack_a1c * fStack_a1c * 0.5;
      auVar57._0_4_ = local_a20 * local_a20 * 0.5;
      auVar57._8_4_ = fStack_a18 * fStack_a18 * 0.5;
      auVar57._12_4_ = fStack_a14 * fStack_a14 * 0.5;
      auVar4 = vsubps_avx(_local_ae0,auVar57);
      local_a50 = auVar4._0_4_;
      fStack_a4c = auVar4._4_4_;
      fStack_a48 = auVar4._8_4_;
      fStack_a44 = auVar4._12_4_;
      local_a60 = CONCAT44(fStack_61c * 0.6933594 + fStack_a1c + fStack_a4c,
                           local_620 * 0.6933594 + local_a20 + local_a50);
      uStack_a58._0_4_ = fStack_618 * 0.6933594 + fStack_a18 + fStack_a48;
      uStack_a58._4_4_ = fStack_614 * 0.6933594 + fStack_a14 + fStack_a44;
      auVar60._8_8_ = uStack_a58;
      auVar60._0_8_ = local_a60;
      auVar3 = vpor_avx(auVar60,auVar3);
      local_cc0 = auVar3._0_4_;
      fStack_cbc = auVar3._4_4_;
      fStack_cb8 = auVar3._8_4_;
      fStack_cb4 = auVar3._12_4_;
      local_c30 = CONCAT44(fVar63 * fStack_cbc,fVar63 * local_cc0);
      uStack_c28._0_4_ = fVar63 * fStack_cb8;
      uStack_c28._4_4_ = fVar63 * fStack_cb4;
      auVar45._8_8_ = uStack_c28;
      auVar45._0_8_ = local_c30;
      auVar44._8_8_ = 0x42b0c0a542b0c0a5;
      auVar44._0_8_ = 0x42b0c0a542b0c0a5;
      auVar3 = vminps_avx(auVar45,auVar44);
      auVar43._8_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar43._0_8_ = 0xc2b0c0a5c2b0c0a5;
      auVar7 = vmaxps_avx(auVar3,auVar43);
      local_b70 = auVar7._0_4_;
      fStack_b6c = auVar7._4_4_;
      fStack_b68 = auVar7._8_4_;
      fStack_b64 = auVar7._12_4_;
      fVar63 = local_b70 * 1.442695 + 0.5;
      fVar64 = fStack_b6c * 1.442695 + 0.5;
      fVar65 = fStack_b68 * 1.442695 + 0.5;
      fVar66 = fStack_b64 * 1.442695 + 0.5;
      local_c50 = CONCAT44(fVar64,fVar63);
      uStack_c48._0_4_ = fVar65;
      uStack_c48._4_4_ = fVar66;
      local_c60 = CONCAT44((int)fVar64,(int)fVar63);
      uStack_c58._0_4_ = (int)fVar65;
      uStack_c58._4_4_ = (int)fVar66;
      auVar52._8_8_ = uStack_c58;
      auVar52._0_8_ = local_c60;
      auVar4 = vcvtdq2ps_avx(auVar52);
      auVar53._8_8_ = uStack_c48;
      auVar53._0_8_ = local_c50;
      auVar3 = vcmpps_avx(auVar53,auVar4,1);
      auVar56._8_8_ = 0x3f8000003f800000;
      auVar56._0_8_ = 0x3f8000003f800000;
      auVar3 = vpand_avx(auVar3,auVar56);
      auVar3 = vsubps_avx(auVar4,auVar3);
      local_6e0 = auVar3._0_4_;
      fStack_6dc = auVar3._4_4_;
      fStack_6d8 = auVar3._8_4_;
      fStack_6d4 = auVar3._12_4_;
      auVar59._4_4_ = fStack_6dc * 0.6933594;
      auVar59._0_4_ = local_6e0 * 0.6933594;
      auVar59._8_4_ = fStack_6d8 * 0.6933594;
      auVar59._12_4_ = fStack_6d4 * 0.6933594;
      auVar3 = vsubps_avx(auVar7,auVar59);
      auVar58._4_4_ = fStack_6dc * -0.00021219444;
      auVar58._0_4_ = local_6e0 * -0.00021219444;
      auVar58._8_4_ = fStack_6d8 * -0.00021219444;
      auVar58._12_4_ = fStack_6d4 * -0.00021219444;
      auVar3 = vsubps_avx(auVar3,auVar58);
      local_b90 = auVar3._0_4_;
      fStack_b8c = auVar3._4_4_;
      fStack_b88 = auVar3._8_4_;
      fStack_b84 = auVar3._12_4_;
      local_c60 = CONCAT44((int)fStack_6dc,(int)local_6e0);
      uStack_c58._0_4_ = (int)fStack_6d8;
      uStack_c58._4_4_ = (int)fStack_6d4;
      auVar47._8_8_ = uStack_c58;
      auVar47._0_8_ = local_c60;
      auVar46._8_8_ = 0x7f0000007f;
      auVar46._0_8_ = 0x7f0000007f;
      auVar3 = vpaddd_avx(auVar47,auVar46);
      auVar3 = vpslld_avx(auVar3,ZEXT416(0x17));
      local_bc0 = auVar3._0_4_;
      fStack_bbc = auVar3._4_4_;
      fStack_bb8 = auVar3._8_4_;
      fStack_bb4 = auVar3._12_4_;
      local_c90 = CONCAT44(((((((fStack_b8c * 0.00019875691 + 0.0013981999) * fStack_b8c +
                               0.008333452) * fStack_b8c + 0.041665796) * fStack_b8c + 0.16666666) *
                             fStack_b8c + 0.5) * fStack_b8c * fStack_b8c + fStack_b8c + 1.0) *
                           fStack_bbc,
                           ((((((local_b90 * 0.00019875691 + 0.0013981999) * local_b90 + 0.008333452
                               ) * local_b90 + 0.041665796) * local_b90 + 0.16666666) * local_b90 +
                            0.5) * local_b90 * local_b90 + local_b90 + 1.0) * local_bc0);
      uStack_c88 = CONCAT44(((((((fStack_b84 * 0.00019875691 + 0.0013981999) * fStack_b84 +
                                0.008333452) * fStack_b84 + 0.041665796) * fStack_b84 + 0.16666666)
                              * fStack_b84 + 0.5) * fStack_b84 * fStack_b84 + fStack_b84 + 1.0) *
                            fStack_bb4,
                            ((((((fStack_b88 * 0.00019875691 + 0.0013981999) * fStack_b88 +
                                0.008333452) * fStack_b88 + 0.041665796) * fStack_b88 + 0.16666666)
                              * fStack_b88 + 0.5) * fStack_b88 * fStack_b88 + fStack_b88 + 1.0) *
                            fStack_bb8);
      *local_4208 = local_c90;
      local_4208[1] = uStack_c88;
      local_41f8 = (undefined1 (*) [32])(*local_41f8 + 0x10);
      local_4200 = local_4200 + 1;
      local_4208 = local_4208 + 2;
    }
  }
  return;
}

Assistant:

static void binary_op_vector_broadcast_pb(const float* ptr, const float* ptr1, float* outptr, int w, int elempack)
{
    const Op op;

#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (elempack == 16)
    {
        int i = 0;
        for (; i < w; i++)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _b = _mm512_set1_ps(*ptr1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 1;
            outptr += 16;
        }
    }
#endif // __AVX512F__
    if (elempack == 8)
    {
        int i = 0;
#if __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m256 _b0 = _mm256_set1_ps(ptr1[0]);
            __m256 _b1 = _mm256_set1_ps(ptr1[1]);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b0), _b1, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 2;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i < w; i++)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _b = _mm256_set1_ps(*ptr1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 1;
            outptr += 8;
        }
    }
#endif // __AVX__
    if (elempack == 4)
    {
        int i = 0;
#if __AVX__
#if __AVX512F__
        for (; i + 3 < w; i += 4)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m128 _b2 = _mm_set1_ps(ptr1[2]);
            __m128 _b3 = _mm_set1_ps(ptr1[3]);
            __m256 _b01 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _b23 = _mm256_insertf128_ps(_mm256_castps128_ps256(_b2), _b3, 1);
            __m512 _b = _mm512_insertf32x8(_mm512_castps256_ps512(_b01), _b23, 1);
            __m512 _outp = op.func_pack16(_p, _b);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            ptr1 += 4;
            outptr += 16;
        }
#endif // __AVX512F__
        for (; i + 1 < w; i += 2)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m128 _b0 = _mm_set1_ps(ptr1[0]);
            __m128 _b1 = _mm_set1_ps(ptr1[1]);
            __m256 _b = _mm256_insertf128_ps(_mm256_castps128_ps256(_b0), _b1, 1);
            __m256 _outp = op.func_pack8(_p, _b);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            ptr1 += 2;
            outptr += 8;
        }
#endif // __AVX__
        for (; i < w; i++)
        {
            __m128 _p = _mm_loadu_ps(ptr);
            __m128 _b = _mm_set1_ps(*ptr1);
            __m128 _outp = op.func_pack4(_p, _b);
            _mm_storeu_ps(outptr, _outp);
            ptr += 4;
            ptr1 += 1;
            outptr += 4;
        }
    }
#endif // __SSE2__
}